

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringAtoRealMethod::~StringAtoRealMethod(StringAtoRealMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~StringAtoRealMethod((StringAtoRealMethod *)0x7ae0f8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit StringAtoRealMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::AToReal, SubroutineKind::Function, 0, {},
                               builtins.realType, true) {}